

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_expr.cpp
# Opt level: O1

void __thiscall ZCC_OpInfoType::FreeAllProtos(ZCC_OpInfoType *this)

{
  ZCC_OpProto *pZVar1;
  ZCC_OpProto *pZVar2;
  
  pZVar2 = this->Protos;
  while (pZVar2 != (ZCC_OpProto *)0x0) {
    pZVar1 = pZVar2->Next;
    operator_delete(pZVar2,0x28);
    pZVar2 = pZVar1;
  }
  this->Protos = (ZCC_OpProto *)0x0;
  return;
}

Assistant:

void ZCC_OpInfoType::FreeAllProtos()
{
	for (ZCC_OpProto *proto = Protos, *next = NULL; proto != NULL; proto = next)
	{
		next = proto->Next;
		delete proto;
	}
	Protos = NULL;
}